

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall QDomElement::removeAttributeNS(QDomElement *this,QString *nsURI,QString *localName)

{
  long lVar1;
  QDomElementPrivate *this_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *n;
  QDomNodePrivate *in_stack_ffffffffffffffa8;
  QDomElementPrivate *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->d).d != (Data *)0x0) &&
     (this_00 = (QDomElementPrivate *)
                QDomElementPrivate::attributeNodeNS
                          (in_stack_ffffffffffffffb0,(QString *)in_stack_ffffffffffffffa8,
                           (QString *)0x1180fe), this_00 != (QDomElementPrivate *)0x0)) {
    QDomNodePrivate::nodeName(in_stack_ffffffffffffffa8);
    QDomElementPrivate::removeAttribute(this_00,in_RDI);
    QString::~QString((QString *)0x118142);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomElement::removeAttributeNS(const QString& nsURI, const QString& localName)
{
    if (!impl)
        return;
    QDomNodePrivate *n = IMPL->attributeNodeNS(nsURI, localName);
    if (!n)
        return;
    IMPL->removeAttribute(n->nodeName());
}